

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::AcesInputFile::AcesInputFile(AcesInputFile *this,IStream *is,int numThreads)

{
  MultiPartInputFile **ppMVar1;
  MultiPartInputFile *pMVar2;
  IStream *is_00;
  RgbaInputFile *in_RDI;
  Data *in_stack_00000290;
  
  in_RDI->_vptr_RgbaInputFile = (_func_int **)&PTR__AcesInputFile_002abbc8;
  ppMVar1 = &in_RDI->_multiPartFile;
  pMVar2 = (MultiPartInputFile *)operator_new(0x70);
  Data::Data((Data *)0x17320d);
  *ppMVar1 = pMVar2;
  is_00 = (IStream *)operator_new(0x40);
  RgbaInputFile::RgbaInputFile(in_RDI,is_00,0);
  (in_RDI->_multiPartFile->_ctxt)._ctxt.
  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)is_00;
  Data::initColorConversion(in_stack_00000290);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (IStream& is, int numThreads) : _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (is, numThreads);
    _data->initColorConversion ();
}